

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O2

void __thiscall glu::Program::Program(Program *this,RenderContext *renderCtx,deUint32 program)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  deUint32 program_00;
  string sStack_38;
  
  iVar2 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  this->m_gl = (Functions *)CONCAT44(extraout_var,iVar2);
  this->m_program = program;
  (this->m_info).infoLog._M_dataplus._M_p = (pointer)&(this->m_info).infoLog.field_2;
  (this->m_info).infoLog._M_string_length = 0;
  program_00 = 0;
  (this->m_info).infoLog.field_2._M_local_buf[0] = '\0';
  (this->m_info).linkOk = false;
  (this->m_info).linkTimeUs = 0;
  bVar1 = getProgramLinkStatus((Functions *)CONCAT44(extraout_var,iVar2),program);
  (this->m_info).linkOk = bVar1;
  getProgramInfoLog_abi_cxx11_(&sStack_38,(glu *)this->m_gl,(Functions *)(ulong)program,program_00);
  std::__cxx11::string::operator=((string *)&this->m_info,(string *)&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

Program::Program (const RenderContext& renderCtx, deUint32 program)
	: m_gl		(renderCtx.getFunctions())
	, m_program	(program)
{
	m_info.linkOk	= getProgramLinkStatus(m_gl, program);
	m_info.infoLog	= getProgramInfoLog(m_gl, program);
}